

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

Tree * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::treeFromString
          (Tree *__return_storage_ptr__,Interpreter *this,string *s)

{
  code *pcVar1;
  csubstr csrc;
  bool bVar2;
  error_flags eVar3;
  Callbacks *cb;
  Tree *pTVar4;
  Parser local_ad0;
  
  csrc = *(csubstr *)&this->heap;
  if ((this->heap).gcTuneGrowthTrigger == 0.0 || *(long *)&this->heap != 0) {
    cb = c4::yml::get_callbacks();
    c4::yml::Parser::Parser(&local_ad0,cb,(ParserOptions)0x0);
    c4::yml::Parser::parse_in_arena(__return_storage_ptr__,&local_ad0,(csubstr)ZEXT816(0),csrc);
    c4::yml::Parser::~Parser(&local_ad0);
    return __return_storage_ptr__;
  }
  eVar3 = c4::get_error_flags();
  if ((eVar3 & 1) != 0) {
    bVar2 = c4::is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      pTVar4 = (Tree *)(*pcVar1)();
      return pTVar4;
    }
  }
  c4::handle_error(0x1fbf87,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x147e,"str || !len_");
}

Assistant:

const ryml::Tree treeFromString(const std::string& s) {
        return ryml::parse_in_arena(ryml::to_csubstr(s));
    }